

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
insert_simplex_and_subfaces<std::initializer_list<short>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          initializer_list<short> *Nsimplex,Filtration_value *filtration)

{
  short sVar1;
  long lVar2;
  initializer_list<short> __ils;
  initializer_list<short> __ils_00;
  bool bVar3;
  Vertex_handle VVar4;
  iterator iVar5;
  reference psVar6;
  iterator iVar7;
  difference_type dVar8;
  int *piVar9;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> first_00;
  undefined8 extraout_RDX;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar11;
  int local_f8;
  undefined1 local_f1;
  undefined8 *local_f0;
  short local_e2;
  iterator iStack_e0;
  Vertex_handle v;
  iterator __end0;
  iterator __begin0;
  vector<short,_std::allocator<short>_> *__range3;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  short *local_a8;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_a0;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_98;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> last_unique;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> local_78;
  const_iterator local_70;
  bool local_61;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_60;
  pointer local_58;
  pointer local_50;
  short *local_48;
  short *last;
  pointer local_38;
  short *local_30;
  short *first;
  Filtration_value *filtration_local;
  initializer_list<short> *Nsimplex_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this_local;
  undefined8 uVar10;
  
  last = (short *)(filtration->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
  local_38 = (filtration->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  __ils._M_array =
       (iterator)
       (filtration->super_vector<int,_std::allocator<int>_>).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __ils._M_len = (size_type)
                 (filtration->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
  filtration_local = filtration;
  Nsimplex_local = Nsimplex;
  this_local = this;
  local_30 = std::begin<short>(__ils);
  local_58 = (filtration_local->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_50 = (filtration_local->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  __ils_00._M_array =
       (iterator)
       (filtration_local->super_vector<int,_std::allocator<int>_>).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __ils_00._M_len =
       (size_type)
       (filtration_local->super_vector<int,_std::allocator<int>_>).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  local_48 = std::end<short>(__ils_00);
  if (local_30 == local_48) {
    null_simplex();
    local_61 = true;
    std::
    pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
    ::
    pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool,_true>
              ((pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
                *)this,&local_60,&local_61);
    uVar10 = extraout_RDX;
  }
  else {
    if ((char)in_FS_OFFSET[-5] == '\0') {
      lVar2 = *in_FS_OFFSET;
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)(lVar2 + -0x40));
      __cxa_thread_atexit(std::vector<short,_std::allocator<short>_>::~vector,
                          (vector<short,_std::allocator<short>_> *)(lVar2 + -0x40),&__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -5) = 1;
    }
    std::vector<short,_std::allocator<short>_>::clear
              ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    lVar2 = *in_FS_OFFSET;
    local_78._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::end
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_70
               ,&local_78);
    std::vector<short,std::allocator<short>>::insert<short_const*,void>
              ((vector<short,std::allocator<short>> *)(lVar2 + -0x40),local_70,local_30,local_48);
    iVar5 = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    last_unique._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::end
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    std::sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               iVar5._M_current,last_unique);
    local_a0._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::begin
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    local_a8 = (short *)std::vector<short,_std::allocator<short>_>::end
                                  ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40))
    ;
    local_98 = std::
               unique<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                         (local_a0,(__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>
                                    )local_a8);
    lVar2 = *in_FS_OFFSET;
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_b0
               ,&local_98);
    local_c0._M_current =
         (short *)std::vector<short,_std::allocator<short>_>::end
                            ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    __gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>::
    __normal_iterator<short*>
              ((__normal_iterator<short_const*,std::vector<short,std::allocator<short>>> *)&local_b8
               ,&local_c0);
    std::vector<short,_std::allocator<short>_>::erase
              ((vector<short,_std::allocator<short>_> *)(lVar2 + -0x40),local_b0,local_b8);
    lVar2 = *in_FS_OFFSET;
    __end0 = std::vector<short,_std::allocator<short>_>::begin
                       ((vector<short,_std::allocator<short>_> *)(lVar2 + -0x40));
    iStack_e0 = std::vector<short,_std::allocator<short>_>::end
                          ((vector<short,_std::allocator<short>_> *)(lVar2 + -0x40));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff20);
      if (!bVar3) break;
      psVar6 = __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&__end0);
      sVar1 = *psVar6;
      local_e2 = sVar1;
      VVar4 = null_vertex((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>
                           *)Nsimplex);
      local_f1 = 0;
      if (sVar1 == VVar4) {
        local_f0 = (undefined8 *)__cxa_allocate_exception(8);
        local_f1 = 1;
        *local_f0 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_f0,&char_const*::typeinfo,0);
      }
      __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::operator++
                (&__end0);
    }
    iVar5 = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    iVar7 = std::vector<short,_std::allocator<short>_>::end
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    dVar8 = std::
            distance<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                      ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                       iVar5._M_current,
                       (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                       iVar7._M_current);
    local_f8 = (int)dVar8 + -1;
    piVar9 = std::max<int>((int *)&Nsimplex[8]._M_len,&local_f8);
    *(int *)&Nsimplex[8]._M_len = *piVar9;
    first_00._M_current =
         (short *)root((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *)
                       Nsimplex);
    iVar5 = std::vector<short,_std::allocator<short>_>::begin
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    iVar7 = std::vector<short,_std::allocator<short>_>::end
                      ((vector<short,_std::allocator<short>_> *)(*in_FS_OFFSET + -0x40));
    pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
                       (this,(Siblings *)Nsimplex,first_00,
                        (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
                        iVar5._M_current,(Filtration_value *)iVar7._M_current);
    uVar10 = pVar11._8_8_;
  }
  pVar11._8_8_ = uVar10;
  pVar11.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }